

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionPosition_setpoint.cpp
# Opt level: O1

void __thiscall
chrono::ChFunctionPosition_setpoint::SetSetpoint
          (ChFunctionPosition_setpoint *this,ChVector<double> *p_setpoint,double s)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  if (this->S < s) {
    this->last_s = this->S;
    dVar6 = (this->P).m_data[1];
    (this->last_P).m_data[0] = (this->P).m_data[0];
    (this->last_P).m_data[1] = dVar6;
    dVar6 = (this->P_ds).m_data[0];
    dVar1 = (this->P_ds).m_data[1];
    dVar2 = (this->P_ds).m_data[2];
    (this->last_P).m_data[2] = (this->P).m_data[2];
    (this->last_P_ds).m_data[0] = dVar6;
    (this->last_P_ds).m_data[1] = dVar1;
    (this->last_P_ds).m_data[2] = dVar2;
  }
  this->S = s;
  if (&this->P != p_setpoint) {
    (this->P).m_data[0] = p_setpoint->m_data[0];
    (this->P).m_data[1] = p_setpoint->m_data[1];
    (this->P).m_data[2] = p_setpoint->m_data[2];
  }
  (this->P_ds).m_data[2] = 0.0;
  (this->P_dsds).m_data[0] = 0.0;
  (this->P_dsds).m_data[1] = 0.0;
  (this->P_dsds).m_data[2] = 0.0;
  (this->P_ds).m_data[0] = 0.0;
  (this->P_ds).m_data[1] = 0.0;
  (this->P_ds).m_data[2] = 0.0;
  (this->P_dsds).m_data[0] = 0.0;
  if (this->mode == SOH) {
    dVar6 = s - this->last_s;
    if (0.0 < dVar6) {
      dVar6 = 1.0 / dVar6;
      dVar3 = dVar6 * ((this->P).m_data[2] - (this->last_P).m_data[2]);
      dVar4 = dVar6 * ((this->P).m_data[1] - (this->last_P).m_data[1]);
      dVar5 = dVar6 * ((this->P).m_data[0] - (this->last_P).m_data[0]);
      (this->P_ds).m_data[0] = dVar5;
      (this->P_ds).m_data[1] = dVar4;
      (this->P_ds).m_data[2] = dVar3;
      dVar1 = (this->last_P_ds).m_data[2];
      dVar2 = (this->last_P_ds).m_data[1];
      (this->P_dsds).m_data[0] = dVar6 * (dVar5 - (this->last_P_ds).m_data[0]);
      (this->P_dsds).m_data[1] = dVar6 * (dVar4 - dVar2);
      (this->P_dsds).m_data[2] = dVar6 * (dVar3 - dVar1);
    }
  }
  else if ((this->mode == FOH) && (dVar6 = s - this->last_s, 0.0 < dVar6)) {
    dVar6 = 1.0 / dVar6;
    dVar1 = (this->P).m_data[2];
    dVar2 = (this->last_P).m_data[2];
    dVar3 = (this->P).m_data[1];
    dVar4 = (this->last_P).m_data[1];
    (this->P_ds).m_data[0] = dVar6 * ((this->P).m_data[0] - (this->last_P).m_data[0]);
    (this->P_ds).m_data[1] = dVar6 * (dVar3 - dVar4);
    (this->P_ds).m_data[2] = dVar6 * (dVar1 - dVar2);
    (this->P_dsds).m_data[0] = 0.0;
    (this->P_dsds).m_data[1] = 0.0;
    (this->P_dsds).m_data[2] = 0.0;
  }
  return;
}

Assistant:

void ChFunctionPosition_setpoint::SetSetpoint(ChVector<> p_setpoint, double s) {
	
	if (s > S) {  
		// if successive setpoint time, scroll buffer of past samples
		last_s = S;
		last_P = P;
		last_P_ds = P_ds;
	}
	else {
		// if same s, just update last sample
	}

	S = s;
	P = p_setpoint;
	P_ds = 0;
	P_dsds = 0;

	if (mode == ZOH) {
		
	}
	if (mode == FOH) {
		double ds = s - last_s;
		if (ds > 0) {
			P_ds = (P - last_P) / ds;
			P_dsds = 0;
		}
	}
	if (mode == SOH) {
		double ds = s - last_s;
		if (ds > 0) {
			P_ds = (P - last_P) / ds;
			P_dsds = (P_ds - last_P_ds) / ds;
		}
	}
}